

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UBool __thiscall icu_63::Edits::Iterator::previous(Iterator *this,UErrorCode *errorCode)

{
  ushort uVar1;
  uint16_t uVar2;
  bool bVar3;
  int32_t iVar4;
  uint16_t *puVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  if (-1 < this->dir) {
    if (this->dir != '\0') {
      if (0 < this->remaining) {
        this->index = this->index + -1;
        this->dir = -1;
        return '\x01';
      }
      this->srcIndex = this->srcIndex + this->oldLength_;
      if (this->changed != '\0') {
        this->replIndex = this->replIndex + this->newLength_;
      }
      this->destIndex = this->destIndex + this->newLength_;
    }
    this->dir = -1;
  }
  iVar8 = this->remaining;
  if (0 < iVar8) {
    uVar7 = this->array[this->index] & 0x1ff;
    if ((int)uVar7 < iVar8) {
      this->remaining = 0;
    }
    else {
      this->remaining = iVar8 + 1;
      this->srcIndex = this->srcIndex - this->oldLength_;
      if (this->changed != '\0') {
        this->replIndex = this->replIndex - this->newLength_;
      }
      this->destIndex = this->destIndex - this->newLength_;
    }
    if (iVar8 <= (int)uVar7) {
      return '\x01';
    }
  }
  if (this->index < 1) {
    *(undefined2 *)((long)&this->newLength_ + 2) = 0;
    *(undefined8 *)&this->dir = 0;
    return '\0';
  }
  puVar5 = this->array;
  uVar7 = this->index - 1;
  this->index = uVar7;
  uVar1 = puVar5[uVar7];
  if (uVar1 < 0x1000) {
    this->changed = '\0';
    iVar8 = uVar1 + 1;
    uVar7 = this->index;
    if (0 < this->index) {
      do {
        uVar1 = puVar5[(ulong)uVar7 - 1];
        if (0xfff < uVar1) break;
        this->index = uVar7 - 1;
        iVar8 = iVar8 + (uint)uVar1 + 1;
        bVar3 = 1 < (int)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar3);
    }
    this->oldLength_ = iVar8;
    this->newLength_ = iVar8;
    this->srcIndex = this->srcIndex - iVar8;
    this->destIndex = this->destIndex - iVar8;
    return '\x01';
  }
  this->changed = '\x01';
  if (uVar1 < 0x7000) {
    uVar6 = (uint)(uVar1 >> 0xc);
    uVar7 = uVar1 >> 9 & 7;
    if (this->coarse == '\0') {
      this->oldLength_ = uVar6;
      this->newLength_ = uVar7;
      if ((uVar1 & 0x1ff) != 0) {
        this->remaining = 1;
      }
      this->srcIndex = this->srcIndex - uVar6;
      this->replIndex = this->replIndex - uVar7;
      this->destIndex = this->destIndex - uVar7;
    }
    else {
      iVar8 = (uVar1 & 0x1ff) + 1;
      this->oldLength_ = uVar6 * iVar8;
      this->newLength_ = iVar8 * uVar7;
    }
    if (this->coarse == '\0') {
      return '\x01';
    }
  }
  else {
    if ((short)uVar1 < 0) {
      uVar9 = (ulong)this->index;
      puVar5 = puVar5 + uVar9;
      do {
        puVar5 = puVar5 + -1;
        uVar2 = *puVar5;
        iVar8 = (int)uVar9;
        uVar7 = iVar8 - 1;
        uVar9 = (ulong)uVar7;
      } while ((short)uVar2 < 0);
      this->index = iVar8;
      iVar4 = readLength(this,(uint)(int)(short)uVar2 >> 6 & 0x3f);
      this->oldLength_ = iVar4;
      iVar4 = readLength(this,(int)(short)uVar2 & 0x3f);
      this->newLength_ = iVar4;
      this->index = uVar7;
    }
    else {
      iVar4 = readLength(this,uVar1 >> 6 & 0x3f);
      this->oldLength_ = iVar4;
      iVar4 = readLength(this,uVar1 & 0x3f);
      this->newLength_ = iVar4;
    }
    if (this->coarse == '\0') goto LAB_0031b053;
  }
  while( true ) {
    uVar7 = this->index;
    if ((int)uVar7 < 1) break;
    uVar1 = this->array[(ulong)uVar7 - 1];
    if (uVar1 < 0x1000) break;
    this->index = uVar7 - 1;
    if (uVar1 < 0x7000) {
      iVar8 = (uVar1 & 0x1ff) + 1;
      this->oldLength_ = this->oldLength_ + (uint)(uVar1 >> 0xc) * iVar8;
      this->newLength_ = this->newLength_ + (uVar1 >> 9 & 7) * iVar8;
    }
    else if (-1 < (short)uVar1) {
      this->index = uVar7;
      iVar4 = readLength(this,uVar1 >> 6 & 0x3f);
      this->oldLength_ = this->oldLength_ + iVar4;
      iVar4 = readLength(this,uVar1 & 0x3f);
      this->newLength_ = this->newLength_ + iVar4;
      this->index = uVar7 - 1;
    }
  }
LAB_0031b053:
  this->srcIndex = this->srcIndex - this->oldLength_;
  if (this->changed != '\0') {
    this->replIndex = this->replIndex - this->newLength_;
  }
  this->destIndex = this->destIndex - this->newLength_;
  return '\x01';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }